

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d57_q2_heap_order2.cpp
# Opt level: O3

void __thiscall
student::student(student *this,string *a_name,vector<int,_std::allocator<int>_> *a_score)

{
  pointer pcVar1;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (a_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + a_name->_M_string_length)
  ;
  std::vector<int,_std::allocator<int>_>::vector(&this->scores,a_score);
  return;
}

Assistant:

student(const std::string &a_name,const std::vector<int> &a_score) : name(a_name), scores(a_score) { }